

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O2

void __thiscall
DetectorSS::DetectorSS(DetectorSS *this,int depth,int width,int lgn,int b,int c,int memory)

{
  uint uVar1;
  int *piVar2;
  uchar **__s;
  uchar *__s_00;
  key_tp **ppkVar3;
  int **ppiVar4;
  key_tp *__s_01;
  unsigned_long *puVar5;
  size_t n;
  uint64_t uVar6;
  uint64_t uVar7;
  ostream *poVar8;
  ulong uVar9;
  int i;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  double __x;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined8 in_XMM1_Qa;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  char name [11];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  (this->heap_).
  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heap_).
  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->heap_).
  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ss_).depth = depth;
  (this->ss_).width = width;
  (this->ss_).lgn = lgn;
  iVar10 = 4;
  if (depth < 4) {
    iVar10 = depth;
  }
  (this->ss_).tdepth = iVar10;
  (this->ss_).b = b;
  (this->ss_).c = c;
  iVar10 = memory - (c + -1) * b;
  if (memory < 1) {
    iVar10 = b * 2;
  }
  (this->ss_).lastb = iVar10;
  if (SBORROW4(iVar10,b * 2) == iVar10 + b * -2 < 0) {
    __x = (double)b;
    auVar14._0_8_ = log(__x);
    auVar14._8_56_ = extraout_var;
    auVar16._0_8_ = (double)c;
    auVar16._8_8_ = in_XMM1_Qa;
    auVar17 = vfmadd231sd_fma(auVar14._0_16_,auVar16,ZEXT816(0x3fe62e42fefa39ef));
    if (22.18070977791825 <= auVar17._0_8_) {
      poVar8 = std::operator<<((ostream *)&std::cout,
                               "Multiresolition bitmap too fine for 32 bit hash: b=");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,b);
      poVar8 = std::operator<<(poVar8,"  c=");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,c);
      std::endl<char,std::char_traits<char>>(poVar8);
    }
    else {
      auVar15._0_8_ = log(__x);
      auVar15._8_56_ = extraout_var_00;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = auVar16._0_8_;
      auVar17 = vfmadd231sd_fma(auVar15._0_16_,auVar17,ZEXT816(0x3fe62e42fefa39ef));
      if (auVar17._0_8_ <= 18.714973875118524) {
        auVar18._8_8_ = 0;
        auVar18._0_8_ = __x;
        auVar17 = vfmadd213sd_fma(ZEXT816(0x3fedcb295e9e1b09),auVar18,ZEXT816(0x3fe0000000000000));
        (this->ss_).setmax = (int)auVar17._0_8_;
        uVar9 = (ulong)(c + 1) << 2;
        if (c < -1) {
          uVar9 = 0xffffffffffffffff;
        }
        piVar2 = (int *)operator_new__(uVar9);
        iVar10 = 0;
        memset(piVar2,0,uVar9);
        (this->ss_).offsets = piVar2;
        for (uVar9 = 0; (uint)(~(c >> 0x1f) & c) != uVar9; uVar9 = uVar9 + 1) {
          piVar2[uVar9] = iVar10;
          iVar10 = iVar10 + b;
        }
        piVar2[c] = (this->ss_).lastb + piVar2[(long)c + -1];
        uVar1 = (this->ss_).depth;
        uVar9 = (long)(int)uVar1 * 8;
        if ((long)(int)uVar1 < 0) {
          uVar9 = 0xffffffffffffffff;
        }
        __s = (uchar **)operator_new__(uVar9);
        memset(__s,0,uVar9);
        (this->ss_).counts = __s;
        iVar10 = (this->ss_).width;
        for (uVar9 = 0; (~((int)uVar1 >> 0x1f) & uVar1) != uVar9; uVar9 = uVar9 + 1) {
          uVar13 = (long)((this->ss_).offsets[c] + 7 >> 3) * (long)iVar10;
          __s_00 = (uchar *)operator_new__(uVar13);
          memset(__s_00,0,uVar13);
          (this->ss_).counts[uVar9] = __s_00;
        }
        uVar9 = (ulong)(uint)depth << 3;
        if (depth < 0) {
          uVar9 = 0xffffffffffffffff;
        }
        ppkVar3 = (key_tp **)operator_new__(uVar9);
        (this->ss_).skey = ppkVar3;
        ppiVar4 = (int **)operator_new__(uVar9);
        (this->ss_).level = ppiVar4;
        uVar13 = (ulong)(uint)width << 2;
        if (width < 0) {
          uVar13 = 0xffffffffffffffff;
        }
        uVar12 = (ulong)(uint)(~(depth >> 0x1f) & depth);
        for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
          __s_01 = (key_tp *)operator_new__(uVar13);
          memset(__s_01,0,uVar13);
          (this->ss_).skey[uVar11] = __s_01;
          piVar2 = (int *)operator_new__(uVar13);
          memset(piVar2,0,uVar13);
          (this->ss_).level[uVar11] = piVar2;
        }
        puVar5 = (unsigned_long *)operator_new__(uVar9);
        (this->ss_).hash = puVar5;
        builtin_strncpy(name,"DetectorSS",0xb);
        n = strlen(name);
        uVar6 = SS_AwareHash((uchar *)name,n,0x30c4becb9,0x35220fe14f,0x18aa1dca9);
        for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
          uVar7 = SS_GenHashSeed((int)uVar6 + (int)uVar9);
          (this->ss_).hash[uVar9] = uVar7;
        }
        return;
      }
      poVar8 = std::operator<<((ostream *)&std::cout,"Unsafe DiscounterMRB for a 32 bit hash: b=");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,b);
      poVar8 = std::operator<<(poVar8,"  c=");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,c);
      std::endl<char,std::char_traits<char>>(poVar8);
    }
  }
  else {
    poVar8 = std::operator<<((ostream *)&std::cout,"Not enough memory for last component: b=");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,b);
    poVar8 = std::operator<<(poVar8,"  c=");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,c);
    poVar8 = std::operator<<(poVar8,"   mem=");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,memory);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  exit(-1);
}

Assistant:

DetectorSS::DetectorSS(int depth, int width, int lgn, int b, int c, int memory) {
	ss_.depth = depth;
	ss_.width = width;
	ss_.lgn = lgn;
	ss_.tdepth = depth > 4 ? 4 : depth;
	//init bitmap
	ss_.b = b;
	ss_.c = c;
	ss_.lastb = (memory > 0 ? memory - (c - 1) * b : b * 2);
	if (ss_.lastb < b * 2) {
		std::cout << "Not enough memory for last component: b=" << b << "  c=" << c
			<< "   mem=" << memory << std::endl;
		exit(-1);
	}
	if (log(b) + log(2) * c >= 32 * log(2)) {
		std::cout << "Multiresolition bitmap too fine for 32 bit hash: b=" << b << "  c="
			<< c << std::endl;
		exit(-1);
	}
	if (log(b) + log(2) * c > 27 * log(2)) {
		std::cout << "Unsafe DiscounterMRB for a 32 bit hash: b=" << b << "  c="
			<< c << std::endl;
		exit(-1);
	}

	ss_.setmax = (int)(b * bitsetratio + 0.5);
	ss_.offsets = new int[c + 1]();
	for (int i = 0; i < c; i++) { ss_.offsets[i] = i * b; }
	ss_.offsets[c] = ss_.offsets[c - 1] + ss_.lastb;
	ss_.counts = new unsigned char* [ss_.depth]();
	for (int i = 0; i < ss_.depth; i++) {
		int size = (ss_.offsets[c] + 7) >> 3;
		ss_.counts[i] = new unsigned char[size * ss_.width]();
	}

	//init SSketch
	ss_.skey = new key_tp * [depth];
	ss_.level = new int* [depth];
	for (int i = 0; i < depth; i++) {
		ss_.skey[i] = new key_tp[width]();
		ss_.level[i] = new int[width]();
	}
	ss_.hash = new unsigned long[depth];
	char name[] = "DetectorSS";
	unsigned long seed = SS_AwareHash((unsigned char*)name, strlen(name), 13091204281, 228204732751, 6620830889);
	for (int i = 0; i < depth; i++) {
		ss_.hash[i] = SS_GenHashSeed(seed++);
	}
}